

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void __thiscall icu_63::SpoofImpl::SpoofImpl(SpoofImpl *this,SpoofImpl *src,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  SpoofData *pSVar3;
  undefined4 extraout_var;
  char *pcVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  SpoofImpl *__fn;
  void *in_R8;
  UErrorCode *status_local;
  SpoofImpl *src_local;
  SpoofImpl *this_local;
  
  __fn = src;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__SpoofImpl_002b5c00;
  this->fMagic = 0;
  this->fChecks = 0xffff;
  this->fSpoofData = (SpoofData *)0x0;
  this->fAllowedCharsSet = (UnicodeSet *)0x0;
  this->fAllowedLocales = (char *)0x0;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this->fMagic = src->fMagic;
    pSVar3 = (SpoofData *)(ulong)(uint)src->fChecks;
    this->fChecks = src->fChecks;
    __child_stack = extraout_RDX;
    if (src->fSpoofData != (SpoofData *)0x0) {
      pSVar3 = SpoofData::addReference(src->fSpoofData);
      this->fSpoofData = pSVar3;
      __child_stack = extraout_RDX_00;
    }
    iVar2 = UnicodeSet::clone(src->fAllowedCharsSet,(__fn *)__fn,__child_stack,(int)pSVar3,in_R8);
    this->fAllowedCharsSet = (UnicodeSet *)CONCAT44(extraout_var,iVar2);
    pcVar4 = uprv_strdup_63(src->fAllowedLocales);
    this->fAllowedLocales = pcVar4;
    if ((this->fAllowedCharsSet == (UnicodeSet *)0x0) || (this->fAllowedLocales == (char *)0x0)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    this->fRestrictionLevel = src->fRestrictionLevel;
  }
  return;
}

Assistant:

SpoofImpl::SpoofImpl(const SpoofImpl &src, UErrorCode &status)  :
        fMagic(0), fChecks(USPOOF_ALL_CHECKS), fSpoofData(NULL), fAllowedCharsSet(NULL) , 
        fAllowedLocales(NULL) {
    if (U_FAILURE(status)) {
        return;
    }
    fMagic = src.fMagic;
    fChecks = src.fChecks;
    if (src.fSpoofData != NULL) {
        fSpoofData = src.fSpoofData->addReference();
    }
    fAllowedCharsSet = static_cast<const UnicodeSet *>(src.fAllowedCharsSet->clone());
    fAllowedLocales = uprv_strdup(src.fAllowedLocales);
    if (fAllowedCharsSet == NULL || fAllowedLocales == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    fRestrictionLevel = src.fRestrictionLevel;
}